

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-server.c
# Opt level: O3

void ssh2channel_send_exit_signal(SshChannel *sc,ptrlen signame,_Bool core_dumped,ptrlen msg)

{
  BinarySink *bs;
  SshChannelVtable *pSVar1;
  PktOut *pPVar2;
  
  pSVar1 = sc[-0xb].vt;
  pPVar2 = ssh2_chanreq_init((ssh2_channel *)(sc + -0xb),"exit-signal",(cr_handler_fn_t)0x0,
                             (void *)0x0);
  bs = pPVar2->binarysink_;
  BinarySink_put_stringpl(bs,signame);
  BinarySink_put_bool(bs,core_dumped);
  BinarySink_put_stringpl(bs,msg);
  BinarySink_put_stringz(bs,"");
  pq_base_push((PacketQueueBase *)pSVar1[1].request_agent_forwarding,&pPVar2->qnode);
  return;
}

Assistant:

void ssh2channel_send_exit_signal(
    SshChannel *sc, ptrlen signame, bool core_dumped, ptrlen msg)
{
    struct ssh2_channel *c = container_of(sc, struct ssh2_channel, sc);
    struct ssh2_connection_state *s = c->connlayer;

    PktOut *pktout = ssh2_chanreq_init(c, "exit-signal", NULL, NULL);
    put_stringpl(pktout, signame);
    put_bool(pktout, core_dumped);
    put_stringpl(pktout, msg);
    put_stringz(pktout, "");           /* language tag */

    pq_push(s->ppl.out_pq, pktout);
}